

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

bool Omega_h::operator==(Graph *a,Graph *b)

{
  bool bVar1;
  bool local_92;
  Read<int> local_78;
  byte local_61;
  Read<int> local_60 [2];
  Read<int> local_40;
  Read<int> local_30;
  Graph *local_20;
  Graph *b_local;
  Graph *a_local;
  
  local_20 = b;
  b_local = a;
  Read<int>::Read(&local_30,&a->a2ab);
  local_61 = 0;
  Read<int>::Read(&local_40,&b->a2ab);
  bVar1 = operator==(&local_30,&local_40);
  local_92 = false;
  if (bVar1) {
    Read<int>::Read(local_60,&a->ab2b);
    local_61 = 1;
    Read<int>::Read(&local_78,&b->ab2b);
    local_92 = operator==(local_60,&local_78);
  }
  a_local._7_1_ = local_92;
  if (bVar1) {
    Read<int>::~Read(&local_78);
  }
  if ((local_61 & 1) != 0) {
    Read<int>::~Read(local_60);
  }
  Read<int>::~Read(&local_40);
  Read<int>::~Read(&local_30);
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

bool operator==(Graph a, Graph b) {
  return a.a2ab == b.a2ab && a.ab2b == b.ab2b;
}